

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

void __thiscall
vkb::detail::GenericFeaturesPNextNode::combine
          (GenericFeaturesPNextNode *this,GenericFeaturesPNextNode *right)

{
  uint32_t i;
  long lVar1;
  uint uVar2;
  
  if (this->sType == right->sType) {
    for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
      uVar2 = 1;
      if (this->fields[lVar1] == 0) {
        uVar2 = (uint)(right->fields[lVar1] != 0);
      }
      this->fields[lVar1] = uVar2;
    }
    return;
  }
  __assert_fail("sType == right.sType && \"Non-matching sTypes in features nodes!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                ,0x39,
                "void vkb::detail::GenericFeaturesPNextNode::combine(const GenericFeaturesPNextNode &)"
               );
}

Assistant:

void GenericFeaturesPNextNode::combine(GenericFeaturesPNextNode const& right) noexcept {
    assert(sType == right.sType && "Non-matching sTypes in features nodes!");
    for (uint32_t i = 0; i < GenericFeaturesPNextNode::field_capacity; i++) {
        fields[i] = fields[i] || right.fields[i];
    }
}